

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O1

void __thiscall Assembler::Assembler(Assembler *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long *plVar3;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  allocator_type local_46a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_469;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_440;
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined4 local_3f8;
  undefined1 *local_3f0 [2];
  undefined1 local_3e0 [16];
  undefined4 local_3d0;
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined4 local_3a8;
  undefined1 *local_3a0 [2];
  undefined1 local_390 [16];
  undefined4 local_380;
  undefined1 *local_378 [2];
  undefined1 local_368 [16];
  undefined4 local_358;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined4 local_330;
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined4 local_308;
  undefined1 *local_300 [2];
  undefined1 local_2f0 [16];
  undefined4 local_2e0;
  undefined1 *local_2d8 [2];
  undefined1 local_2c8 [16];
  undefined4 local_2b8;
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined4 local_268;
  undefined1 *local_260 [2];
  undefined1 local_250 [16];
  undefined4 local_240;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined4 local_1f0;
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined4 local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  undefined4 local_1a0;
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined4 local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined4 local_150;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined4 local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined4 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined4 local_60;
  long *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  
  local_468 = &(this->inputFileName).field_2;
  (this->inputFileName)._M_dataplus._M_p = (pointer)local_468;
  (this->inputFileName)._M_string_length = 0;
  (this->inputFileName).field_2._M_local_buf[0] = '\0';
  (this->outputFileName)._M_dataplus._M_p = (pointer)&(this->outputFileName).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->outputFileName,"out.o","");
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bytes).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->symbolTable)._M_t._M_impl.super__Rb_tree_header;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbolTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->relocationTable)._M_t._M_impl.super__Rb_tree_header;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->relocationTable)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->codeBySection)._M_t._M_impl.super__Rb_tree_header;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->codeBySection)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_440.first._M_dataplus._M_p = (pointer)&local_440.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"halt","");
  local_440.second = 0;
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"iret","");
  local_3f8 = 0x20;
  local_3f0[0] = local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"ret","");
  local_3d0 = 0x40;
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"int","");
  local_3a8 = 0x10;
  local_3a0[0] = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"call","");
  local_380 = 0x30;
  local_378[0] = local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"jmp","");
  local_358 = 0x50;
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"jeq","");
  local_330 = 0x51;
  local_328[0] = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"jne","");
  local_308 = 0x52;
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,"jgt","");
  local_2e0 = 0x53;
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"ldr","");
  local_2b8 = 0xa0;
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"shr","");
  local_290 = 0x91;
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"str","");
  local_268 = 0xb0;
  local_260[0] = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"push","");
  local_240 = 0xb0;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"pop","");
  local_218 = 0xa0;
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"xchg","");
  local_1f0 = 0x60;
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"add","");
  local_1c8 = 0x70;
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"sub","");
  local_1a0 = 0x71;
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"mul","");
  local_178 = 0x72;
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"div","");
  local_150 = 0x73;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"cmp","");
  local_128 = 0x74;
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"not","");
  local_100 = 0x80;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"and","");
  local_d8 = 0x81;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"or","");
  local_b0 = 0x82;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"xor","");
  local_88 = 0x83;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"test","");
  local_60 = 0x84;
  plVar3 = local_48;
  local_58[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"shl","");
  local_38 = 0x90;
  __l._M_len = 0x1a;
  __l._M_array = &local_440;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->instrDescription,__l,&local_469,&local_46a);
  lVar2 = -0x410;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  this->isLabelWithoutCode = false;
  return;
}

Assistant:

Assembler() {
        isLabelWithoutCode = false;
    }